

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

int __thiscall
QTextCursor::select(QTextCursor *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
                   fd_set *__exceptfds,timeval *__timeout)

{
  QTextDocumentPrivate *pQVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  QTextCursorPrivate *pQVar5;
  MoveOperation op;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (this->d).d.ptr;
  if (pQVar5 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      pQVar5 = (this->d).d.ptr;
    }
    if (pQVar5->priv != (QTextDocumentPrivate *)0x0) {
      clearSelection(this);
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar5 = (this->d).d.ptr;
      }
      pQVar1 = pQVar5->priv;
      uVar3 = QFragmentMapData<QTextBlockData>::findNode(&(pQVar1->blocks).data,pQVar5->position,0);
      local_38._8_4_ = uVar3;
      local_38._0_8_ = pQVar1;
      switch(__nfds) {
      case 0:
        movePosition(this,StartOfWord,MoveAnchor,1);
        op = EndOfWord;
        break;
      case 1:
        movePosition(this,StartOfLine,MoveAnchor,1);
        op = EndOfLine;
        break;
      case 2:
        iVar4 = QTextBlock::length((QTextBlock *)local_38);
        if (iVar4 == 1) goto switchD_004bd0fc_default;
        movePosition(this,StartOfBlock,MoveAnchor,1);
        bVar2 = movePosition(this,PreviousBlock,MoveAnchor,1);
        if (bVar2) {
          movePosition(this,EndOfBlock,MoveAnchor,1);
          movePosition(this,NextBlock,KeepAnchor,1);
        }
        op = EndOfBlock;
        break;
      case 3:
        movePosition(this,Start,MoveAnchor,1);
        op = End;
        break;
      default:
        goto switchD_004bd0fc_default;
      }
      movePosition(this,op,KeepAnchor,1);
    }
  }
switchD_004bd0fc_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTextCursor::select(SelectionType selection)
{
    if (!d || !d->priv)
        return;

    clearSelection();

    const QTextBlock block = d->block();

    switch (selection) {
        case LineUnderCursor:
            movePosition(StartOfLine);
            movePosition(EndOfLine, KeepAnchor);
            break;
        case WordUnderCursor:
            movePosition(StartOfWord);
            movePosition(EndOfWord, KeepAnchor);
            break;
        case BlockUnderCursor:
            if (block.length() == 1) // no content
                break;
            movePosition(StartOfBlock);
            // also select the paragraph separator
            if (movePosition(PreviousBlock)) {
                movePosition(EndOfBlock);
                movePosition(NextBlock, KeepAnchor);
            }
            movePosition(EndOfBlock, KeepAnchor);
            break;
        case Document:
            movePosition(Start);
            movePosition(End, KeepAnchor);
            break;
    }
}